

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
          (SmallVectorTemplateBase<llvm::StringRef,_true> *this,StringRef *Elt)

{
  size_t sVar1;
  size_t sVar2;
  iterator pSVar3;
  StringRef *Elt_local;
  SmallVectorTemplateBase<llvm::StringRef,_true> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    grow(this,0);
  }
  pSVar3 = SmallVectorTemplateCommon<llvm::StringRef,_void>::end
                     (&this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>);
  pSVar3->Data = Elt->Data;
  pSVar3->Length = Elt->Length;
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }